

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_hal.cpp
# Opt level: O0

MPP_RET mpp_enc_hal_init(MppEncHal *ctx,MppEncHalCfg *cfg)

{
  uint uVar1;
  MPP_RET MVar2;
  MppCodingType *ptr;
  void *pvVar3;
  uint local_2c;
  MPP_RET ret;
  RK_U32 i;
  MppEncHalImpl *p;
  MppEncHalCfg *cfg_local;
  MppEncHal *ctx_local;
  
  if ((ctx == (MppEncHal *)0x0) || (cfg == (MppEncHalCfg *)0x0)) {
    _mpp_log_l(2,"mpp_enc_hal","found NULL input ctx %p cfg %p\n","mpp_enc_hal_init",ctx,cfg);
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    *ctx = (MppEncHal)0x0;
    ptr = (MppCodingType *)mpp_osal_calloc("mpp_enc_hal_init",0x20);
    if (ptr == (MppCodingType *)0x0) {
      _mpp_log_l(2,"mpp_enc_hal","malloc failed\n","mpp_enc_hal_init");
      ctx_local._4_4_ = MPP_ERR_MALLOC;
    }
    else {
      for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
        if (cfg->coding == hw_enc_apis[local_2c]->coding) {
          *ptr = cfg->coding;
          *(MppEncHalApi **)(ptr + 4) = hw_enc_apis[local_2c];
          pvVar3 = mpp_osal_calloc("mpp_enc_hal_init",
                                   (ulong)*(uint *)(*(undefined8 *)(ptr + 4) +
                                                   (MPP_VIDEO_CodingMJPEG|MPP_VIDEO_CodingMPEG4)));
          *(void **)(ptr + 2) = pvVar3;
          uVar1 = (**(code **)(*(undefined8 *)(ptr + 4) + 0x18))(*(undefined8 *)(ptr + 2),cfg);
          if (uVar1 == 0) {
            MVar2 = hal_task_group_init((HalTaskGroup *)(ptr + 6),3,cfg->task_cnt,0x238);
            if (MVar2 == MPP_OK) {
              cfg->tasks = *(HalTaskGroup *)(ptr + 6);
              *ctx = ptr;
              return MPP_OK;
            }
            _mpp_log_l(2,"mpp_enc_hal","hal_task_group_init failed ret %d\n","mpp_enc_hal_init",
                       (ulong)(uint)MVar2);
          }
          else {
            _mpp_log_l(2,"mpp_enc_hal","hal %s init failed ret %d\n","mpp_enc_hal_init",
                       hw_enc_apis[local_2c]->name,(ulong)uVar1);
          }
          break;
        }
      }
      _mpp_log_l(2,"mpp_enc_hal","could not found coding type %d\n","mpp_enc_hal_init",
                 (ulong)cfg->coding);
      mpp_osal_free("mpp_enc_hal_init",*(void **)(ptr + 2));
      mpp_osal_free("mpp_enc_hal_init",ptr);
      ctx_local._4_4_ = MPP_NOK;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET mpp_enc_hal_init(MppEncHal *ctx, MppEncHalCfg *cfg)
{
    if (NULL == ctx || NULL == cfg) {
        mpp_err_f("found NULL input ctx %p cfg %p\n", ctx, cfg);
        return MPP_ERR_NULL_PTR;
    }
    *ctx = NULL;

    MppEncHalImpl *p = mpp_calloc(MppEncHalImpl, 1);
    if (NULL == p) {
        mpp_err_f("malloc failed\n");
        return MPP_ERR_MALLOC;
    }

    RK_U32 i;
    for (i = 0; i < MPP_ARRAY_ELEMS(hw_enc_apis); i++) {
        if (cfg->coding == hw_enc_apis[i]->coding) {
            p->coding       = cfg->coding;
            p->api          = hw_enc_apis[i];
            p->ctx          = mpp_calloc_size(void, p->api->ctx_size);

            MPP_RET ret = p->api->init(p->ctx, cfg);
            if (ret) {
                mpp_err_f("hal %s init failed ret %d\n", hw_enc_apis[i]->name, ret);
                break;
            }

            ret = hal_task_group_init(&p->tasks, TASK_BUTT, cfg->task_cnt,
                                      sizeof(EncAsyncTaskInfo));
            if (ret) {
                mpp_err_f("hal_task_group_init failed ret %d\n", ret);
                break;
            }

            cfg->tasks = p->tasks;
            *ctx = p;
            return MPP_OK;
        }
    }

    mpp_err_f("could not found coding type %d\n", cfg->coding);
    mpp_free(p->ctx);
    mpp_free(p);

    return MPP_NOK;
}